

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

P<r_code::Code> * __thiscall
r_code::vector<core::P<r_code::Code>_>::operator[](vector<core::P<r_code::Code>_> *this,size_t i)

{
  pointer pPVar1;
  _Object *p_Var2;
  int iVar3;
  pointer pPVar4;
  P<r_code::Code> *__n;
  P<r_code::Code> *extraout_RAX;
  undefined4 extraout_var;
  ulong uVar5;
  char *this_00;
  pointer pPVar6;
  
  pPVar4 = (this->m_vector).
           super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(this->m_vector).
                super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3;
  if (uVar5 <= i) {
    std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::resize
              (&this->m_vector,i + 1);
    pPVar4 = (this->m_vector).
             super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->m_vector).
                  super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3;
  }
  if (uVar5 <= i) {
    this_00 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    pPVar4 = (((vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *)this_00)->
             super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (((vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *)this_00)->
             super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar5 = (long)pPVar1 - (long)pPVar4 >> 3;
    __n = (P<r_code::Code> *)(i - uVar5);
    if (i < uVar5 || __n == (P<r_code::Code> *)0x0) {
      if ((i < uVar5) && (pPVar4 = pPVar4 + i, pPVar6 = pPVar4, pPVar1 != pPVar4)) {
        do {
          p_Var2 = pPVar6->object;
          if (p_Var2 != (_Object *)0x0) {
            LOCK();
            (p_Var2->refCount).super___atomic_base<long>._M_i =
                 (p_Var2->refCount).super___atomic_base<long>._M_i + -1;
            UNLOCK();
            __n = (P<r_code::Code> *)(p_Var2->refCount).super___atomic_base<long>._M_i;
            if ((long)__n < 1) {
              iVar3 = (*p_Var2->_vptr__Object[1])();
              __n = (P<r_code::Code> *)CONCAT44(extraout_var,iVar3);
            }
          }
          pPVar6 = pPVar6 + 1;
        } while (pPVar6 != pPVar1);
        (((vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *)this_00)->
        super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>)._M_impl.
        super__Vector_impl_data._M_finish = pPVar4;
      }
      return __n;
    }
    std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::_M_default_append
              ((vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *)this_00,
               (size_type)__n);
    return extraout_RAX;
  }
  return pPVar4 + i;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }